

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

uint __thiscall kmp_basic_flag<unsigned_int>::unset_sleeping(kmp_basic_flag<unsigned_int> *this)

{
  uint uVar1;
  atomic<unsigned_int> *paVar2;
  kmp_flag<unsigned_int> *in_RDI;
  bool bVar3;
  uint uStack_58;
  
  paVar2 = kmp_flag<unsigned_int>::get(in_RDI);
  uStack_58 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
  do {
    LOCK();
    uVar1 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
    bVar3 = uStack_58 == uVar1;
    if (bVar3) {
      (paVar2->super___atomic_base<unsigned_int>)._M_i = uStack_58 & 0xfffffffe;
      uVar1 = uStack_58;
    }
    UNLOCK();
    uStack_58 = uVar1;
  } while (!bVar3);
  return uVar1;
}

Assistant:

FlagType unset_sleeping() {
    return KMP_ATOMIC_AND(this->get(), ~KMP_BARRIER_SLEEP_STATE);
  }